

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O1

void place_stairs(chunk_conflict *c,loc_conflict grid,_Bool quest,wchar_t feat)

{
  int iVar1;
  wchar_t feat_00;
  
  iVar1 = c->depth;
  if (quest || iVar1 == 0) {
    square_set_feat(c,(loc)grid,(uint)(iVar1 == 0) + L'\x05');
    return;
  }
  feat_00 = L'\x05';
  if (iVar1 < (int)(z_info->max_depth - 1)) {
    feat_00 = feat;
  }
  square_set_feat(c,(loc)grid,feat_00);
  return;
}

Assistant:

static void place_stairs(struct chunk *c, struct loc grid, bool quest, int feat)
{
	if (!c->depth) {
		square_set_feat(c, grid, FEAT_MORE);
	} else if (quest || c->depth >= z_info->max_depth - 1) {
		square_set_feat(c, grid, FEAT_LESS);
	} else {
		square_set_feat(c, grid, feat);
	}
}